

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Ptr_t * Pdr_ManCollectCubes(Pdr_Man_t *p,int kStart)

{
  void *pvVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long lVar5;
  Vec_Vec_t *pVVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  size_t __size;
  int iVar11;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pVVar6 = p->vClauses;
  if (kStart < pVVar6->nSize) {
    uVar9 = (ulong)(uint)kStart;
    iVar10 = 0;
    iVar7 = 100;
    do {
      if (kStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar1 = pVVar6->pArray[uVar9];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar5 = (long)iVar10;
        __size = lVar5 << 4;
        iVar11 = iVar10 * 2;
        lVar8 = 0;
        do {
          pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + lVar8 * 8);
          if (iVar10 + (int)lVar8 == iVar7) {
            ppvVar4 = pVVar3->pArray;
            if (lVar5 + lVar8 < 0x10) {
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,0x80);
              }
              pVVar3->pArray = ppvVar4;
              iVar7 = 0x10;
            }
            else {
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc(__size);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,__size);
              }
              pVVar3->pArray = ppvVar4;
              iVar7 = iVar11;
            }
          }
          else {
            ppvVar4 = pVVar3->pArray;
          }
          ppvVar4[lVar5 + lVar8] = pvVar2;
          lVar8 = lVar8 + 1;
          iVar11 = iVar11 + 2;
          __size = __size + 0x10;
        } while (lVar8 < *(int *)((long)pvVar1 + 4));
        iVar10 = iVar10 + (int)lVar8;
        pVVar3->nSize = iVar10;
        pVVar3->nCap = iVar7;
        pVVar6 = p->vClauses;
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < pVVar6->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Pdr_ManCollectCubes( Pdr_Man_t * p, int kStart )
{
    Vec_Ptr_t * vResult;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pSet;
    int i, j;
    vResult = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, kStart )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pSet, j )
            Vec_PtrPush( vResult, pSet );
    return vResult;
}